

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O1

void test_colnam(FILE *out,FitsHdu *hduptr)

{
  uint uVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  char **ppcVar4;
  byte bVar5;
  int iVar6;
  void *__ptr;
  char *pcVar7;
  __int32_t **pp_Var8;
  void *__base;
  undefined8 *puVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  size_t __nmemb;
  ulong uVar14;
  long lVar15;
  
  uVar1 = hduptr->ncols;
  __nmemb = (size_t)(int)uVar1;
  if ((long)__nmemb < 1) {
    return;
  }
  __ptr = malloc(__nmemb * 8);
  ppcVar4 = ttype;
  sVar11 = 0;
  do {
    pcVar7 = (char *)malloc(0x47);
    *(char **)((long)__ptr + sVar11 * 8) = pcVar7;
    strcpy(pcVar7,ppcVar4[sVar11]);
    sVar11 = sVar11 + 1;
  } while (__nmemb != sVar11);
  sVar11 = 0;
  do {
    pbVar2 = (byte *)ttype[sVar11];
    if (*pbVar2 == 0) {
      sprintf(errmes,"Column #%d has no name (No TTYPE%d keyword).",(ulong)((int)sVar11 + 1));
      wrtwrn(out,errmes,0);
    }
    else {
      bVar5 = *pbVar2;
      if (bVar5 != 0) {
        lVar10 = *(long *)((long)__ptr + sVar11 * 8);
        uVar13 = (int)sVar11 + 1;
        lVar15 = 0;
        do {
          if ((((byte)(bVar5 - 0x3a) < 0xf6) && ((byte)((bVar5 & 0xdf) + 0xa5) < 0xe6)) &&
             (bVar5 != 0x5f)) {
            if (bVar5 == 0x26) {
              sprintf(errmes,
                      "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')"
                      ,(ulong)uVar13,(ulong)uVar13,0x26);
            }
            else {
              sprintf(errmes,
                      "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\"."
                      ,(ulong)uVar13,ttype[sVar11],(ulong)(uint)(int)(char)bVar5);
            }
            wrtwrn(out,errmes,0);
          }
          bVar5 = pbVar2[lVar15];
          pp_Var8 = __ctype_toupper_loc();
          *(char *)(lVar10 + lVar15) = (char)(*pp_Var8)[(char)bVar5];
          bVar5 = pbVar2[lVar15 + 1];
          lVar15 = lVar15 + 1;
        } while (bVar5 != 0);
      }
    }
    sVar11 = sVar11 + 1;
  } while (sVar11 != __nmemb);
  __base = calloc(__nmemb,8);
  uVar12 = 1;
  if (1 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  uVar14 = 0;
  do {
    puVar9 = (undefined8 *)malloc(0x10);
    *(undefined8 **)((long)__base + uVar14 * 8) = puVar9;
    *puVar9 = *(undefined8 *)((long)__ptr + uVar14 * 8);
    uVar14 = uVar14 + 1;
    *(int *)(puVar9 + 1) = (int)uVar14;
  } while (uVar12 != uVar14);
  qsort(__base,__nmemb,8,compcol);
  if (uVar1 != 1) {
    uVar13 = 2;
    if (2 < (int)uVar1) {
      uVar13 = uVar1;
    }
    uVar12 = 0;
    do {
      puVar9 = *(undefined8 **)((long)__base + uVar12 * 8);
      pcVar7 = (char *)*puVar9;
      if (*pcVar7 != '\0') {
        puVar3 = *(undefined8 **)((long)__base + uVar12 * 8 + 8);
        iVar6 = strcmp(pcVar7,(char *)*puVar3);
        if (iVar6 == 0) {
          lVar10 = (long)*(int *)(puVar9 + 1);
          lVar15 = (long)*(int *)(puVar3 + 1);
          sprintf(errmes,"Columns #%d, %s and #%d, %s are not unique (case insensitive).",lVar10,
                  ttype[lVar10 + -1],lVar15,ttype[lVar15 + -1]);
          wrtwrn(out,errmes,0);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 - 1 != uVar12);
  }
  uVar12 = 1;
  if (1 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  uVar14 = 0;
  do {
    free(*(void **)((long)__base + uVar14 * 8));
    free(*(void **)((long)__ptr + uVar14 * 8));
    uVar14 = uVar14 + 1;
  } while (uVar12 != uVar14);
  free(__base);
  free(__ptr);
  return;
}

Assistant:

void test_colnam(FILE *out, 
		FitsHdu *hduptr)
{ 
    int i,n; 
    char *p, *q;
    ColName **cols; 
    char **ttypecopy;

    n = hduptr->ncols; 

    if(n <= 0) return;
    /* make a local working copy of ttype */
    ttypecopy = (char **)malloc(n*sizeof(char *));
    for (i = 0; i < n; i++) { 
        ttypecopy[i] = (char *)malloc(FLEN_VALUE*sizeof(char));
        strcpy(ttypecopy[i],ttype[i]);
    } 

    /* check whether there are any other non ASCII-text characters 
      (FITS standard R14). Also "uppercase" the working copies. */
    for (i = 0; i < n; i++) { 
        p = ttype[i];
        q = ttypecopy[i];
        if(!strlen(p)) { 
            sprintf(errmes,
            "Column #%d has no name (No TTYPE%d keyword).",i+1, i+1);
            wrtwrn(out,errmes,0);
            continue;
        }


/*      disable this check (it was only a warning) 
        if( (*p  > 'z' || *p < 'a') && (*p > 'Z' || *p <'A') 
                && (*p > '9' || *p < '0') ) { 
            sprintf(errmes,"Column #%d: Name \"%s\" does not begin with a letter or a digit.",i+1,ttype[i]);
            wrtwrn(out,errmes,1);
        }  
*/
        while(*p != '\0') {
            if ((*p > 'z' || *p < 'a') && (*p > 'Z' || *p < 'A')
                 && (*p > '9' || *p < '0') && (*p != '_')) {
               if (*p == '&') {
                  sprintf(errmes,
                  "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')",
                  i+1,i+1,*p);
                  wrtwrn(out,errmes,0);
               } else {
                  sprintf(errmes,
                  "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\".",
                  i+1,ttype[i],*p);
                  wrtwrn(out,errmes,0);
               }
            }
            if(*p <= 'z' || *p >= 'a') *q = toupper(*p);
            p++; q++;
        }
    }

    cols = (ColName **)calloc(n, sizeof(ColName *));
    for (i=0; i < n; i++) { 
        cols[i] = (ColName *)malloc(sizeof(ColName));
	cols[i]->name = ttypecopy[i];
	cols[i]->index = i+1; 
    }
    
    /* sort the column name in the ascending order of name field*/ 
    qsort(cols, n, sizeof(ColName *), compcol); 

    /* Check the duplication of the column name */ 
    for (i = 0; i < n-1; i++) { 
        if(!strlen(cols[i]->name)) continue;

/*      disable this warning
        if(!strncmp(cols[i]->name,cols[i+1]->name,16)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique within first 16 characters(case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,1);
        }
*/

        if(!strcmp(cols[i]->name,cols[i+1]->name)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique (case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,0);
        }
    }  
    for (i = 0; i < n; i++) { free(cols[i]); free(ttypecopy[i]);}
    free(cols); free(ttypecopy);
    return;
}